

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O0

void __thiscall deqp::gls::TheilSenCalibrator::clear(TheilSenCalibrator *this)

{
  TheilSenCalibrator *this_local;
  
  MeasureState::clear(&this->m_measureState);
  std::vector<deqp::gls::CalibrateIteration,_std::allocator<deqp::gls::CalibrateIteration>_>::clear
            (&this->m_calibrateIterations);
  this->m_state = INTERNALSTATE_CALIBRATING;
  return;
}

Assistant:

void TheilSenCalibrator::clear (void)
{
	m_measureState.clear();
	m_calibrateIterations.clear();
	m_state = INTERNALSTATE_CALIBRATING;
}